

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoord2DArray
               (vector<float,_std::allocator<float>_> *dst,int layerNdx,Vec2 *bottomLeft,
               Vec2 *topRight)

{
  reference pvVar1;
  float fVar2;
  Vec2 *topRight_local;
  Vec2 *bottomLeft_local;
  int layerNdx_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  fVar2 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar1 = fVar2;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar1 = (float)layerNdx;
  fVar2 = tcu::Vector<float,_2>::x(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar1 = fVar2;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar1 = (float)layerNdx;
  fVar2 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(bottomLeft);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar1 = fVar2;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,8);
  *pvVar1 = (float)layerNdx;
  fVar2 = tcu::Vector<float,_2>::x(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,9);
  *pvVar1 = fVar2;
  fVar2 = tcu::Vector<float,_2>::y(topRight);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,10);
  *pvVar1 = fVar2;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
  *pvVar1 = (float)layerNdx;
  return;
}

Assistant:

void computeQuadTexCoord2DArray (std::vector<float>& dst, int layerNdx, const tcu::Vec2& bottomLeft, const tcu::Vec2& topRight)
{
	dst.resize(4*3);

	dst[0] = bottomLeft.x();	dst[ 1] = bottomLeft.y();	dst[ 2] = (float)layerNdx;
	dst[3] = bottomLeft.x();	dst[ 4] = topRight.y();		dst[ 5] = (float)layerNdx;
	dst[6] = topRight.x();		dst[ 7] = bottomLeft.y();	dst[ 8] = (float)layerNdx;
	dst[9] = topRight.x();		dst[10] = topRight.y();		dst[11] = (float)layerNdx;
}